

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_adapt.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  Int IVar4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  undefined8 uVar8;
  char *pcVar9;
  allocator local_79a;
  allocator local_799;
  Write<double> local_798;
  Write<double> local_780 [2];
  int argc_local;
  path metric_out;
  path mesh_out;
  path mesh_in;
  path metric_in;
  char **argv_local;
  Read<double> metric;
  string metric_out_ext;
  string metric_in_ext;
  CommPtr comm;
  CmdLine cmdline;
  Write<double> local_620;
  Write<double> local_610;
  Write<double> local_600;
  Write<double> local_5f0;
  Write<double> local_5e0;
  AdaptOpts opts;
  undefined1 local_5c0 [64];
  TransferOpts local_580 [256];
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_480;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_470;
  Mesh mesh;
  Library lib;
  
  argc_local = argc;
  argv_local = argv;
  Omega_h::Library::Library(&lib,&argc_local,&argv_local);
  Omega_h::Library::world();
  Omega_h::CmdLine::CmdLine(&cmdline);
  std::__cxx11::string::string((string *)&mesh,"--mesh-in",(allocator *)&mesh_in);
  std::__cxx11::string::string((string *)&opts,"input mesh file path",(allocator *)&mesh_out);
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)&cmdline,(string *)&mesh);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&mesh);
  std::__cxx11::string::string((string *)&mesh,"mesh.msh",(allocator *)&mesh_in);
  local_5c0[0] = 0;
  _opts = local_5c0;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,(string *)&mesh);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&mesh);
  std::__cxx11::string::string((string *)&mesh,"--mesh-out",(allocator *)&mesh_in);
  std::__cxx11::string::string((string *)&opts,"output mesh file path",(allocator *)&mesh_out);
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)&cmdline,(string *)&mesh);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&mesh);
  std::__cxx11::string::string((string *)&mesh,"mesh.msh",(allocator *)&mesh_in);
  local_5c0[0] = 0;
  _opts = local_5c0;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,(string *)&mesh);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&mesh);
  std::__cxx11::string::string((string *)&mesh,"--metric-in",(allocator *)&mesh_in);
  std::__cxx11::string::string((string *)&opts,"input metric file path",(allocator *)&mesh_out);
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)&cmdline,(string *)&mesh);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&mesh);
  std::__cxx11::string::string((string *)&mesh,"metric.txt",(allocator *)&mesh_in);
  local_5c0[0] = 0;
  _opts = local_5c0;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,(string *)&mesh);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&mesh);
  std::__cxx11::string::string((string *)&mesh,"--metric-out",(allocator *)&mesh_in);
  std::__cxx11::string::string((string *)&opts,"output metric file path",(allocator *)&mesh_out);
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)&cmdline,(string *)&mesh);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&mesh);
  std::__cxx11::string::string((string *)&mesh,"metric.txt",(allocator *)&mesh_in);
  local_5c0[0] = 0;
  _opts = local_5c0;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,(string *)&mesh);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&mesh);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_470,&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  cVar2 = Omega_h::CmdLine::parse_final(&cmdline,&local_470,&argc_local,argv_local);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_470._M_refcount);
  iVar5 = -1;
  if (cVar2 != '\0') {
    std::__cxx11::string::string((string *)&mesh,"--mesh-in",(allocator *)&opts);
    cVar2 = Omega_h::CmdLine::parsed((string *)&cmdline);
    std::__cxx11::string::~string((string *)&mesh);
    if (cVar2 == '\0') {
      pcVar9 = "No input mesh file specified\n";
    }
    else {
      std::__cxx11::string::string((string *)&mesh,"--mesh-out",(allocator *)&opts);
      cVar2 = Omega_h::CmdLine::parsed((string *)&cmdline);
      std::__cxx11::string::~string((string *)&mesh);
      if (cVar2 == '\0') {
        pcVar9 = "No output mesh file specified\n";
      }
      else {
        std::__cxx11::string::string((string *)&mesh,"--metric-in",(allocator *)&opts);
        cVar2 = Omega_h::CmdLine::parsed((string *)&cmdline);
        std::__cxx11::string::~string((string *)&mesh);
        if (cVar2 != '\0') {
          std::__cxx11::string::string((string *)&opts,"--mesh-in",(allocator *)&metric_in);
          std::__cxx11::string::string((string *)&mesh_out,"mesh.msh",(allocator *)&metric_in_ext);
          Omega_h::CmdLine::get<std::__cxx11::string>((string *)&mesh,(string *)&cmdline);
          Omega_h::filesystem::path::path(&mesh_in,(string *)&mesh);
          std::__cxx11::string::~string((string *)&mesh);
          std::__cxx11::string::~string((string *)&mesh_out);
          std::__cxx11::string::~string((string *)&opts);
          std::__cxx11::string::string((string *)&opts,"--mesh-out",(allocator *)&metric_in_ext);
          std::__cxx11::string::string((string *)&metric_in,"mesh.msh",(allocator *)&metric_out);
          Omega_h::CmdLine::get<std::__cxx11::string>((string *)&mesh,(string *)&cmdline);
          Omega_h::filesystem::path::path(&mesh_out,(string *)&mesh);
          std::__cxx11::string::~string((string *)&mesh);
          std::__cxx11::string::~string((string *)&metric_in);
          std::__cxx11::string::~string((string *)&opts);
          std::__cxx11::string::string((string *)&opts,"--metric-in",(allocator *)&metric_out);
          std::__cxx11::string::string
                    ((string *)&metric_in_ext,"metric.txt",(allocator *)&metric_out_ext);
          Omega_h::CmdLine::get<std::__cxx11::string>((string *)&mesh,(string *)&cmdline);
          Omega_h::filesystem::path::path(&metric_in,(string *)&mesh);
          std::__cxx11::string::~string((string *)&mesh);
          std::__cxx11::string::~string((string *)&metric_in_ext);
          std::__cxx11::string::~string((string *)&opts);
          poVar7 = std::operator<<((ostream *)&std::cout,"Loading mesh from ");
          poVar7 = (ostream *)Omega_h::filesystem::operator<<(poVar7,&mesh_in);
          std::operator<<(poVar7,"\n");
          std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_480,&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
          ;
          Omega_h::gmsh::read(&mesh,&mesh_in,&local_480);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_480._M_refcount);
          local_798.shared_alloc_.alloc = (Alloc *)0x0;
          local_798.shared_alloc_.direct_ptr = (void *)0x0;
          poVar7 = std::operator<<((ostream *)&std::cout,"Loading target metric from ");
          poVar7 = (ostream *)Omega_h::filesystem::operator<<(poVar7,&metric_in);
          std::operator<<(poVar7,"\n");
          IVar4 = Omega_h::Mesh::dim(&mesh);
          Omega_h::filesystem::path::extension();
          Omega_h::filesystem::path::string_abi_cxx11_();
          std::__cxx11::string::~string((string *)&opts);
          bVar3 = std::operator==(&metric_in_ext,".txt");
          if (!bVar3) {
            uVar8 = Omega_h::filesystem::path::c_str();
            Omega_h::fail("unknown extension for \"%s\"\n",uVar8);
LAB_00104fe1:
            uVar8 = Omega_h::filesystem::path::c_str();
            uVar8 = Omega_h::fail("unknown extension for \"%s\"\n",uVar8);
            Omega_h::Write<double>::~Write(&local_620);
            Omega_h::Write<double>::~Write(&metric.write_);
            std::__cxx11::string::~string((string *)&metric_out_ext);
            std::__cxx11::string::~string((string *)&metric_out);
            Omega_h::TransferOpts::~TransferOpts(local_580);
            std::__cxx11::string::~string((string *)&metric_in_ext);
            Omega_h::Write<double>::~Write(&local_798);
            Omega_h::Mesh::~Mesh(&mesh);
            std::__cxx11::string::~string((string *)&metric_in);
            std::__cxx11::string::~string((string *)&mesh_out);
            std::__cxx11::string::~string((string *)&mesh_in);
            Omega_h::CmdLine::~CmdLine(&cmdline);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            Omega_h::Library::~Library(&lib);
            _Unwind_Resume(uVar8);
          }
          iVar5 = Omega_h::Mesh::nverts();
          uVar1 = (long)((IVar4 + 1) * IVar4) / 2;
          Omega_h::read_reals_txt((path *)&opts,(int)&metric_in,iVar5);
          Omega_h::Write<double>::operator=(&local_798,(Write<double> *)&opts);
          Omega_h::Write<double>::~Write((Write<double> *)&opts);
          Omega_h::Write<double>::Write(&local_5e0,&local_798);
          Omega_h::symms_inria2osh(&opts,IVar4,&local_5e0);
          Omega_h::Write<double>::operator=(&local_798,(Write<double> *)&opts);
          Omega_h::Write<double>::~Write((Write<double> *)&opts);
          Omega_h::Write<double>::~Write(&local_5e0);
          std::__cxx11::string::string((string *)&opts,"target_metric",(allocator *)&metric_out);
          Omega_h::Write<double>::Write(&local_5f0,&local_798);
          Omega_h::Mesh::add_tag<double>(&mesh,0,&opts,uVar1 & 0xffffffff,&local_5f0,0);
          Omega_h::Write<double>::~Write(&local_5f0);
          std::__cxx11::string::~string((string *)&opts);
          Omega_h::AdaptOpts::AdaptOpts(&opts,&mesh);
          Omega_h::Write<double>::Write(&local_600,&local_798);
          Omega_h::grade_fix_adapt(&mesh,&opts,&local_600,1);
          Omega_h::Write<double>::~Write(&local_600);
          poVar7 = std::operator<<((ostream *)&std::cout,"Storing mesh in ");
          poVar7 = (ostream *)Omega_h::filesystem::operator<<(poVar7,&mesh_out);
          std::operator<<(poVar7,'\n');
          Omega_h::gmsh::write(&mesh_out,&mesh);
          std::__cxx11::string::string
                    ((string *)&metric_out,"--metric-out",(allocator *)&metric_out_ext);
          cVar2 = Omega_h::CmdLine::parsed((string *)&cmdline);
          std::__cxx11::string::~string((string *)&metric_out);
          if (cVar2 != '\0') {
            std::__cxx11::string::string((string *)local_780,"--metric-out",&local_79a);
            std::__cxx11::string::string((string *)&metric,"metric.txt",&local_799);
            Omega_h::CmdLine::get<std::__cxx11::string>
                      ((string *)&metric_out_ext,(string *)&cmdline);
            Omega_h::filesystem::path::path(&metric_out,(string *)&metric_out_ext);
            std::__cxx11::string::~string((string *)&metric_out_ext);
            std::__cxx11::string::~string((string *)&metric);
            std::__cxx11::string::~string((string *)local_780);
            Omega_h::filesystem::path::extension();
            Omega_h::filesystem::path::string_abi_cxx11_();
            std::__cxx11::string::~string((string *)local_780);
            poVar7 = std::operator<<((ostream *)&std::cout,"Storing metric in ");
            poVar7 = (ostream *)Omega_h::filesystem::operator<<(poVar7,&metric_out);
            std::operator<<(poVar7,'\n');
            bVar3 = std::operator==(&metric_out_ext,".txt");
            if (!bVar3) goto LAB_00104fe1;
            std::__cxx11::string::string((string *)local_780,"metric",&local_79a);
            Omega_h::Mesh::get_array<double>((int)&metric,(string *)&mesh);
            std::__cxx11::string::~string((string *)local_780);
            Omega_h::Write<double>::Write(&local_610,&metric.write_);
            Omega_h::symms_osh2inria(local_780,IVar4,&local_610);
            Omega_h::Write<double>::operator=(&metric.write_,local_780);
            Omega_h::Write<double>::~Write(local_780);
            Omega_h::Write<double>::~Write(&local_610);
            Omega_h::Write<double>::Write(&local_620,&metric.write_);
            Omega_h::write_reals_txt(&metric_out,&local_620,uVar1 & 0xffffffff);
            Omega_h::Write<double>::~Write(&local_620);
            Omega_h::Write<double>::~Write(&metric.write_);
            std::__cxx11::string::~string((string *)&metric_out_ext);
            std::__cxx11::string::~string((string *)&metric_out);
          }
          Omega_h::TransferOpts::~TransferOpts(local_580);
          std::__cxx11::string::~string((string *)&metric_in_ext);
          Omega_h::Write<double>::~Write(&local_798);
          Omega_h::Mesh::~Mesh(&mesh);
          std::__cxx11::string::~string((string *)&metric_in);
          std::__cxx11::string::~string((string *)&mesh_out);
          std::__cxx11::string::~string((string *)&mesh_in);
          iVar5 = 0;
          goto LAB_00104f8e;
        }
        pcVar9 = "No input metric file specified\n";
      }
    }
    std::operator<<((ostream *)&std::cout,pcVar9);
    Omega_h::CmdLine::show_help((char **)&cmdline);
  }
LAB_00104f8e:
  Omega_h::CmdLine::~CmdLine(&cmdline);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Omega_h::Library::~Library(&lib);
  return iVar5;
}

Assistant:

int main(int argc, char** argv) {
  auto lib = Omega_h::Library(&argc, &argv);
  auto comm = lib.world();
  Omega_h::CmdLine cmdline;
#ifdef OMEGA_H_USE_LIBMESHB
  auto metric_doc = "metric.{txt,sol}";
#else
  auto metric_doc = "metric.txt";
#endif
  auto& mesh_in_flag = cmdline.add_flag("--mesh-in", "input mesh file path");
  mesh_in_flag.add_arg<std::string>("mesh.msh");
  auto& mesh_out_flag = cmdline.add_flag("--mesh-out", "output mesh file path");
  mesh_out_flag.add_arg<std::string>("mesh.msh");
  auto& metric_in_flag =
      cmdline.add_flag("--metric-in", "input metric file path");
  metric_in_flag.add_arg<std::string>(metric_doc);
  auto& metric_out_flag =
      cmdline.add_flag("--metric-out", "output metric file path");
  metric_out_flag.add_arg<std::string>(metric_doc);
  if (!cmdline.parse_final(comm, &argc, argv)) {
    return -1;
  }
  if (!cmdline.parsed("--mesh-in")) {
    std::cout << "No input mesh file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  if (!cmdline.parsed("--mesh-out")) {
    std::cout << "No output mesh file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  if (!cmdline.parsed("--metric-in")) {
    std::cout << "No input metric file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  Omega_h::filesystem::path mesh_in =
      cmdline.get<std::string>("--mesh-in", "mesh.msh");
  Omega_h::filesystem::path mesh_out =
      cmdline.get<std::string>("--mesh-out", "mesh.msh");
  Omega_h::filesystem::path metric_in =
      cmdline.get<std::string>("--metric-in", metric_doc);
  std::cout << "Loading mesh from " << mesh_in << "\n";
  auto mesh = Omega_h::gmsh::read(mesh_in, comm);
  Omega_h::Reals target_metric;
  std::cout << "Loading target metric from " << metric_in << "\n";
  auto const dim = mesh.dim();
  auto const metric_in_ext = metric_in.extension().string();
  if (metric_in_ext == ".txt") {
    target_metric = Omega_h::read_reals_txt(
        metric_in, mesh.nverts(), Omega_h::symm_ncomps(dim));
    target_metric = Omega_h::symms_inria2osh(dim, target_metric);
    mesh.add_tag(0, "target_metric", Omega_h::symm_ncomps(dim), target_metric);
  } else
#ifdef OMEGA_H_USE_LIBMESHB
      if (metric_in_ext == ".sol" || metric_in_ext == ".solb") {
    Omega_h::meshb::read_sol(&mesh, metric_in.c_str(), "target_metric");
    target_metric = mesh.get_array<Omega_h::Real>(0, "target_metric");
  } else
#endif
  {
    Omega_h_fail("unknown extension for \"%s\"\n", metric_in.c_str());
  }
  auto opts = Omega_h::AdaptOpts(&mesh);
  Omega_h::grade_fix_adapt(&mesh, opts, target_metric, /*verbose=*/true);
  std::cout << "Storing mesh in " << mesh_out << '\n';
  Omega_h::gmsh::write(mesh_out, &mesh);
  if (cmdline.parsed("--metric-out")) {
    Omega_h::filesystem::path metric_out =
        cmdline.get<std::string>("--metric-out", metric_doc);
    auto const metric_out_ext = metric_out.extension().string();
    std::cout << "Storing metric in " << metric_out << '\n';
    if (metric_out_ext == ".txt") {
      auto metric = mesh.get_array<Omega_h::Real>(0, "metric");
      metric = Omega_h::symms_osh2inria(dim, metric);
      Omega_h::write_reals_txt(metric_out, metric, Omega_h::symm_ncomps(dim));
    } else
#ifdef OMEGA_H_USE_LIBMESHB
        if (metric_out_ext == ".sol" || metric_out_ext == ".solb") {
      Omega_h::meshb::write_sol(&mesh, metric_out.c_str(), "metric");
    } else
#endif
    {
      Omega_h_fail("unknown extension for \"%s\"\n", metric_out.c_str());
    }
  }
}